

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_NV_vertex_program(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_NV_vertex_program != 0) {
    glad_glVertexAttribs2fvNV = (PFNGLVERTEXATTRIBS2FVNVPROC)(*load)("glVertexAttribs2fvNV",userptr)
    ;
    glad_glBindProgramNV = (PFNGLBINDPROGRAMNVPROC)(*load)("glBindProgramNV",userptr);
    glad_glVertexAttrib3sNV = (PFNGLVERTEXATTRIB3SNVPROC)(*load)("glVertexAttrib3sNV",userptr);
    glad_glGetProgramParameterdvNV =
         (PFNGLGETPROGRAMPARAMETERDVNVPROC)(*load)("glGetProgramParameterdvNV",userptr);
    glad_glVertexAttrib4fNV = (PFNGLVERTEXATTRIB4FNVPROC)(*load)("glVertexAttrib4fNV",userptr);
    glad_glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC)(*load)("glVertexAttrib3d",userptr);
    glad_glGetVertexAttribPointerv =
         (PFNGLGETVERTEXATTRIBPOINTERVPROC)(*load)("glGetVertexAttribPointerv",userptr);
    glad_glVertexAttrib3fvNV = (PFNGLVERTEXATTRIB3FVNVPROC)(*load)("glVertexAttrib3fvNV",userptr);
    glad_glDeleteProgramsNV = (PFNGLDELETEPROGRAMSNVPROC)(*load)("glDeleteProgramsNV",userptr);
    glad_glVertexAttribs4fvNV = (PFNGLVERTEXATTRIBS4FVNVPROC)(*load)("glVertexAttribs4fvNV",userptr)
    ;
    glad_glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC)(*load)("glVertexAttrib3sv",userptr);
    glad_glVertexAttrib4svNV = (PFNGLVERTEXATTRIB4SVNVPROC)(*load)("glVertexAttrib4svNV",userptr);
    glad_glVertexAttrib4fvNV = (PFNGLVERTEXATTRIB4FVNVPROC)(*load)("glVertexAttrib4fvNV",userptr);
    glad_glVertexAttribPointerNV =
         (PFNGLVERTEXATTRIBPOINTERNVPROC)(*load)("glVertexAttribPointerNV",userptr);
    glad_glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC)(*load)("glVertexAttrib4dv",userptr);
    glad_glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC)(*load)("glVertexAttrib4f",userptr);
    glad_glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC)(*load)("glVertexAttrib4d",userptr);
    glad_glProgramParameters4dvNV =
         (PFNGLPROGRAMPARAMETERS4DVNVPROC)(*load)("glProgramParameters4dvNV",userptr);
    glad_glVertexAttribs3svNV = (PFNGLVERTEXATTRIBS3SVNVPROC)(*load)("glVertexAttribs3svNV",userptr)
    ;
    glad_glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC)(*load)("glDeleteProgramsARB",userptr);
    glad_glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC)(*load)("glVertexAttrib4s",userptr);
    glad_glVertexAttrib1fNV = (PFNGLVERTEXATTRIB1FNVPROC)(*load)("glVertexAttrib1fNV",userptr);
    glad_glGetVertexAttribivNV =
         (PFNGLGETVERTEXATTRIBIVNVPROC)(*load)("glGetVertexAttribivNV",userptr);
    glad_glVertexAttrib1dNV = (PFNGLVERTEXATTRIB1DNVPROC)(*load)("glVertexAttrib1dNV",userptr);
    glad_glBindProgramARB = (PFNGLBINDPROGRAMARBPROC)(*load)("glBindProgramARB",userptr);
    glad_glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC)(*load)("glGetVertexAttribfv",userptr);
    glad_glProgramParameter4dvNV =
         (PFNGLPROGRAMPARAMETER4DVNVPROC)(*load)("glProgramParameter4dvNV",userptr);
    glad_glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC)(*load)("glVertexAttrib1d",userptr);
    glad_glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC)(*load)("glVertexAttrib1f",userptr);
    glad_glVertexAttribs1fvNV = (PFNGLVERTEXATTRIBS1FVNVPROC)(*load)("glVertexAttribs1fvNV",userptr)
    ;
    glad_glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC)(*load)("glVertexAttrib2s",userptr);
    glad_glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC)(*load)("glVertexAttrib1s",userptr);
    glad_glProgramParameter4fNV =
         (PFNGLPROGRAMPARAMETER4FNVPROC)(*load)("glProgramParameter4fNV",userptr);
    glad_glGetProgramivNV = (PFNGLGETPROGRAMIVNVPROC)(*load)("glGetProgramivNV",userptr);
    glad_glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC)(*load)("glVertexAttrib2dv",userptr);
    glad_glVertexAttrib1fvNV = (PFNGLVERTEXATTRIB1FVNVPROC)(*load)("glVertexAttrib1fvNV",userptr);
    glad_glProgramParameter4dNV =
         (PFNGLPROGRAMPARAMETER4DNVPROC)(*load)("glProgramParameter4dNV",userptr);
    glad_glVertexAttrib2dvNV = (PFNGLVERTEXATTRIB2DVNVPROC)(*load)("glVertexAttrib2dvNV",userptr);
    glad_glVertexAttrib4dNV = (PFNGLVERTEXATTRIB4DNVPROC)(*load)("glVertexAttrib4dNV",userptr);
    glad_glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC)(*load)("glVertexAttrib1dv",userptr);
    glad_glGenProgramsNV = (PFNGLGENPROGRAMSNVPROC)(*load)("glGenProgramsNV",userptr);
    glad_glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC)(*load)("glVertexAttrib1sv",userptr);
    glad_glGetProgramStringNV = (PFNGLGETPROGRAMSTRINGNVPROC)(*load)("glGetProgramStringNV",userptr)
    ;
    glad_glVertexAttrib3dvNV = (PFNGLVERTEXATTRIB3DVNVPROC)(*load)("glVertexAttrib3dvNV",userptr);
    glad_glVertexAttrib2sNV = (PFNGLVERTEXATTRIB2SNVPROC)(*load)("glVertexAttrib2sNV",userptr);
    glad_glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC)(*load)("glGetVertexAttribdv",userptr);
    glad_glVertexAttrib4sNV = (PFNGLVERTEXATTRIB4SNVPROC)(*load)("glVertexAttrib4sNV",userptr);
    glad_glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC)(*load)("glVertexAttrib3f",userptr);
    glad_glTrackMatrixNV = (PFNGLTRACKMATRIXNVPROC)(*load)("glTrackMatrixNV",userptr);
    glad_glAreProgramsResidentNV =
         (PFNGLAREPROGRAMSRESIDENTNVPROC)(*load)("glAreProgramsResidentNV",userptr);
    glad_glVertexAttribs4ubvNV =
         (PFNGLVERTEXATTRIBS4UBVNVPROC)(*load)("glVertexAttribs4ubvNV",userptr);
    glad_glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC)(*load)("glVertexAttrib4sv",userptr);
    glad_glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC)(*load)("glVertexAttrib3s",userptr);
    glad_glVertexAttribs1svNV = (PFNGLVERTEXATTRIBS1SVNVPROC)(*load)("glVertexAttribs1svNV",userptr)
    ;
    glad_glVertexAttrib1svNV = (PFNGLVERTEXATTRIB1SVNVPROC)(*load)("glVertexAttrib1svNV",userptr);
    glad_glVertexAttribs4svNV = (PFNGLVERTEXATTRIBS4SVNVPROC)(*load)("glVertexAttribs4svNV",userptr)
    ;
    glad_glVertexAttribs1dvNV = (PFNGLVERTEXATTRIBS1DVNVPROC)(*load)("glVertexAttribs1dvNV",userptr)
    ;
    glad_glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC)(*load)("glVertexAttrib1fv",userptr);
    glad_glVertexAttrib4ubNV = (PFNGLVERTEXATTRIB4UBNVPROC)(*load)("glVertexAttrib4ubNV",userptr);
    glad_glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC)(*load)("glVertexAttrib4fv",userptr);
    glad_glLoadProgramNV = (PFNGLLOADPROGRAMNVPROC)(*load)("glLoadProgramNV",userptr);
    glad_glVertexAttribs3fvNV = (PFNGLVERTEXATTRIBS3FVNVPROC)(*load)("glVertexAttribs3fvNV",userptr)
    ;
    glad_glIsProgramARB = (PFNGLISPROGRAMARBPROC)(*load)("glIsProgramARB",userptr);
    glad_glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC)(*load)("glGenProgramsARB",userptr);
    glad_glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC)(*load)("glVertexAttrib4Nub",userptr);
    glad_glGetProgramParameterfvNV =
         (PFNGLGETPROGRAMPARAMETERFVNVPROC)(*load)("glGetProgramParameterfvNV",userptr);
    glad_glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC)(*load)("glGetVertexAttribiv",userptr);
    glad_glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC)(*load)("glVertexAttrib3fv",userptr);
    glad_glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC)(*load)("glVertexAttrib2fv",userptr);
    glad_glRequestResidentProgramsNV =
         (PFNGLREQUESTRESIDENTPROGRAMSNVPROC)(*load)("glRequestResidentProgramsNV",userptr);
    glad_glVertexAttrib3svNV = (PFNGLVERTEXATTRIB3SVNVPROC)(*load)("glVertexAttrib3svNV",userptr);
    glad_glGetVertexAttribdvNV =
         (PFNGLGETVERTEXATTRIBDVNVPROC)(*load)("glGetVertexAttribdvNV",userptr);
    glad_glVertexAttribs4dvNV = (PFNGLVERTEXATTRIBS4DVNVPROC)(*load)("glVertexAttribs4dvNV",userptr)
    ;
    glad_glVertexAttribs3dvNV = (PFNGLVERTEXATTRIBS3DVNVPROC)(*load)("glVertexAttribs3dvNV",userptr)
    ;
    glad_glGetTrackMatrixivNV = (PFNGLGETTRACKMATRIXIVNVPROC)(*load)("glGetTrackMatrixivNV",userptr)
    ;
    glad_glVertexAttrib1sNV = (PFNGLVERTEXATTRIB1SNVPROC)(*load)("glVertexAttrib1sNV",userptr);
    glad_glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC)(*load)("glVertexAttrib4Nubv",userptr);
    glad_glVertexAttrib2fvNV = (PFNGLVERTEXATTRIB2FVNVPROC)(*load)("glVertexAttrib2fvNV",userptr);
    glad_glVertexAttrib3dNV = (PFNGLVERTEXATTRIB3DNVPROC)(*load)("glVertexAttrib3dNV",userptr);
    glad_glVertexAttribs2dvNV = (PFNGLVERTEXATTRIBS2DVNVPROC)(*load)("glVertexAttribs2dvNV",userptr)
    ;
    glad_glExecuteProgramNV = (PFNGLEXECUTEPROGRAMNVPROC)(*load)("glExecuteProgramNV",userptr);
    glad_glIsProgramNV = (PFNGLISPROGRAMNVPROC)(*load)("glIsProgramNV",userptr);
    glad_glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC)(*load)("glVertexAttrib2sv",userptr);
    glad_glVertexAttrib2fNV = (PFNGLVERTEXATTRIB2FNVPROC)(*load)("glVertexAttrib2fNV",userptr);
    glad_glVertexAttrib3fNV = (PFNGLVERTEXATTRIB3FNVPROC)(*load)("glVertexAttrib3fNV",userptr);
    glad_glProgramParameters4fvNV =
         (PFNGLPROGRAMPARAMETERS4FVNVPROC)(*load)("glProgramParameters4fvNV",userptr);
    glad_glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC)(*load)("glVertexAttrib2d",userptr);
    glad_glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC)(*load)("glVertexAttrib2f",userptr);
    glad_glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC)(*load)("glVertexAttrib3dv",userptr);
    glad_glGetVertexAttribfvNV =
         (PFNGLGETVERTEXATTRIBFVNVPROC)(*load)("glGetVertexAttribfvNV",userptr);
    glad_glVertexAttrib4ubvNV = (PFNGLVERTEXATTRIB4UBVNVPROC)(*load)("glVertexAttrib4ubvNV",userptr)
    ;
    glad_glVertexAttrib2dNV = (PFNGLVERTEXATTRIB2DNVPROC)(*load)("glVertexAttrib2dNV",userptr);
    glad_glVertexAttrib2svNV = (PFNGLVERTEXATTRIB2SVNVPROC)(*load)("glVertexAttrib2svNV",userptr);
    glad_glGetVertexAttribPointervNV =
         (PFNGLGETVERTEXATTRIBPOINTERVNVPROC)(*load)("glGetVertexAttribPointervNV",userptr);
    glad_glProgramParameter4fvNV =
         (PFNGLPROGRAMPARAMETER4FVNVPROC)(*load)("glProgramParameter4fvNV",userptr);
    glad_glVertexAttrib4dvNV = (PFNGLVERTEXATTRIB4DVNVPROC)(*load)("glVertexAttrib4dvNV",userptr);
    glad_glVertexAttrib1dvNV = (PFNGLVERTEXATTRIB1DVNVPROC)(*load)("glVertexAttrib1dvNV",userptr);
    glad_glVertexAttribs2svNV = (PFNGLVERTEXATTRIBS2SVNVPROC)(*load)("glVertexAttribs2svNV",userptr)
    ;
  }
  return;
}

Assistant:

static void glad_gl_load_GL_NV_vertex_program( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_NV_vertex_program) return;
    glVertexAttribs2fvNV = (PFNGLVERTEXATTRIBS2FVNVPROC) load("glVertexAttribs2fvNV", userptr);
    glBindProgramNV = (PFNGLBINDPROGRAMNVPROC) load("glBindProgramNV", userptr);
    glVertexAttrib3sNV = (PFNGLVERTEXATTRIB3SNVPROC) load("glVertexAttrib3sNV", userptr);
    glGetProgramParameterdvNV = (PFNGLGETPROGRAMPARAMETERDVNVPROC) load("glGetProgramParameterdvNV", userptr);
    glVertexAttrib4fNV = (PFNGLVERTEXATTRIB4FNVPROC) load("glVertexAttrib4fNV", userptr);
    glVertexAttrib3d = (PFNGLVERTEXATTRIB3DPROC) load("glVertexAttrib3d", userptr);
    glGetVertexAttribPointerv = (PFNGLGETVERTEXATTRIBPOINTERVPROC) load("glGetVertexAttribPointerv", userptr);
    glVertexAttrib3fvNV = (PFNGLVERTEXATTRIB3FVNVPROC) load("glVertexAttrib3fvNV", userptr);
    glDeleteProgramsNV = (PFNGLDELETEPROGRAMSNVPROC) load("glDeleteProgramsNV", userptr);
    glVertexAttribs4fvNV = (PFNGLVERTEXATTRIBS4FVNVPROC) load("glVertexAttribs4fvNV", userptr);
    glVertexAttrib3sv = (PFNGLVERTEXATTRIB3SVPROC) load("glVertexAttrib3sv", userptr);
    glVertexAttrib4svNV = (PFNGLVERTEXATTRIB4SVNVPROC) load("glVertexAttrib4svNV", userptr);
    glVertexAttrib4fvNV = (PFNGLVERTEXATTRIB4FVNVPROC) load("glVertexAttrib4fvNV", userptr);
    glVertexAttribPointerNV = (PFNGLVERTEXATTRIBPOINTERNVPROC) load("glVertexAttribPointerNV", userptr);
    glVertexAttrib4dv = (PFNGLVERTEXATTRIB4DVPROC) load("glVertexAttrib4dv", userptr);
    glVertexAttrib4f = (PFNGLVERTEXATTRIB4FPROC) load("glVertexAttrib4f", userptr);
    glVertexAttrib4d = (PFNGLVERTEXATTRIB4DPROC) load("glVertexAttrib4d", userptr);
    glProgramParameters4dvNV = (PFNGLPROGRAMPARAMETERS4DVNVPROC) load("glProgramParameters4dvNV", userptr);
    glVertexAttribs3svNV = (PFNGLVERTEXATTRIBS3SVNVPROC) load("glVertexAttribs3svNV", userptr);
    glDeleteProgramsARB = (PFNGLDELETEPROGRAMSARBPROC) load("glDeleteProgramsARB", userptr);
    glVertexAttrib4s = (PFNGLVERTEXATTRIB4SPROC) load("glVertexAttrib4s", userptr);
    glVertexAttrib1fNV = (PFNGLVERTEXATTRIB1FNVPROC) load("glVertexAttrib1fNV", userptr);
    glGetVertexAttribivNV = (PFNGLGETVERTEXATTRIBIVNVPROC) load("glGetVertexAttribivNV", userptr);
    glVertexAttrib1dNV = (PFNGLVERTEXATTRIB1DNVPROC) load("glVertexAttrib1dNV", userptr);
    glBindProgramARB = (PFNGLBINDPROGRAMARBPROC) load("glBindProgramARB", userptr);
    glGetVertexAttribfv = (PFNGLGETVERTEXATTRIBFVPROC) load("glGetVertexAttribfv", userptr);
    glProgramParameter4dvNV = (PFNGLPROGRAMPARAMETER4DVNVPROC) load("glProgramParameter4dvNV", userptr);
    glVertexAttrib1d = (PFNGLVERTEXATTRIB1DPROC) load("glVertexAttrib1d", userptr);
    glVertexAttrib1f = (PFNGLVERTEXATTRIB1FPROC) load("glVertexAttrib1f", userptr);
    glVertexAttribs1fvNV = (PFNGLVERTEXATTRIBS1FVNVPROC) load("glVertexAttribs1fvNV", userptr);
    glVertexAttrib2s = (PFNGLVERTEXATTRIB2SPROC) load("glVertexAttrib2s", userptr);
    glVertexAttrib1s = (PFNGLVERTEXATTRIB1SPROC) load("glVertexAttrib1s", userptr);
    glProgramParameter4fNV = (PFNGLPROGRAMPARAMETER4FNVPROC) load("glProgramParameter4fNV", userptr);
    glGetProgramivNV = (PFNGLGETPROGRAMIVNVPROC) load("glGetProgramivNV", userptr);
    glVertexAttrib2dv = (PFNGLVERTEXATTRIB2DVPROC) load("glVertexAttrib2dv", userptr);
    glVertexAttrib1fvNV = (PFNGLVERTEXATTRIB1FVNVPROC) load("glVertexAttrib1fvNV", userptr);
    glProgramParameter4dNV = (PFNGLPROGRAMPARAMETER4DNVPROC) load("glProgramParameter4dNV", userptr);
    glVertexAttrib2dvNV = (PFNGLVERTEXATTRIB2DVNVPROC) load("glVertexAttrib2dvNV", userptr);
    glVertexAttrib4dNV = (PFNGLVERTEXATTRIB4DNVPROC) load("glVertexAttrib4dNV", userptr);
    glVertexAttrib1dv = (PFNGLVERTEXATTRIB1DVPROC) load("glVertexAttrib1dv", userptr);
    glGenProgramsNV = (PFNGLGENPROGRAMSNVPROC) load("glGenProgramsNV", userptr);
    glVertexAttrib1sv = (PFNGLVERTEXATTRIB1SVPROC) load("glVertexAttrib1sv", userptr);
    glGetProgramStringNV = (PFNGLGETPROGRAMSTRINGNVPROC) load("glGetProgramStringNV", userptr);
    glVertexAttrib3dvNV = (PFNGLVERTEXATTRIB3DVNVPROC) load("glVertexAttrib3dvNV", userptr);
    glVertexAttrib2sNV = (PFNGLVERTEXATTRIB2SNVPROC) load("glVertexAttrib2sNV", userptr);
    glGetVertexAttribdv = (PFNGLGETVERTEXATTRIBDVPROC) load("glGetVertexAttribdv", userptr);
    glVertexAttrib4sNV = (PFNGLVERTEXATTRIB4SNVPROC) load("glVertexAttrib4sNV", userptr);
    glVertexAttrib3f = (PFNGLVERTEXATTRIB3FPROC) load("glVertexAttrib3f", userptr);
    glTrackMatrixNV = (PFNGLTRACKMATRIXNVPROC) load("glTrackMatrixNV", userptr);
    glAreProgramsResidentNV = (PFNGLAREPROGRAMSRESIDENTNVPROC) load("glAreProgramsResidentNV", userptr);
    glVertexAttribs4ubvNV = (PFNGLVERTEXATTRIBS4UBVNVPROC) load("glVertexAttribs4ubvNV", userptr);
    glVertexAttrib4sv = (PFNGLVERTEXATTRIB4SVPROC) load("glVertexAttrib4sv", userptr);
    glVertexAttrib3s = (PFNGLVERTEXATTRIB3SPROC) load("glVertexAttrib3s", userptr);
    glVertexAttribs1svNV = (PFNGLVERTEXATTRIBS1SVNVPROC) load("glVertexAttribs1svNV", userptr);
    glVertexAttrib1svNV = (PFNGLVERTEXATTRIB1SVNVPROC) load("glVertexAttrib1svNV", userptr);
    glVertexAttribs4svNV = (PFNGLVERTEXATTRIBS4SVNVPROC) load("glVertexAttribs4svNV", userptr);
    glVertexAttribs1dvNV = (PFNGLVERTEXATTRIBS1DVNVPROC) load("glVertexAttribs1dvNV", userptr);
    glVertexAttrib1fv = (PFNGLVERTEXATTRIB1FVPROC) load("glVertexAttrib1fv", userptr);
    glVertexAttrib4ubNV = (PFNGLVERTEXATTRIB4UBNVPROC) load("glVertexAttrib4ubNV", userptr);
    glVertexAttrib4fv = (PFNGLVERTEXATTRIB4FVPROC) load("glVertexAttrib4fv", userptr);
    glLoadProgramNV = (PFNGLLOADPROGRAMNVPROC) load("glLoadProgramNV", userptr);
    glVertexAttribs3fvNV = (PFNGLVERTEXATTRIBS3FVNVPROC) load("glVertexAttribs3fvNV", userptr);
    glIsProgramARB = (PFNGLISPROGRAMARBPROC) load("glIsProgramARB", userptr);
    glGenProgramsARB = (PFNGLGENPROGRAMSARBPROC) load("glGenProgramsARB", userptr);
    glVertexAttrib4Nub = (PFNGLVERTEXATTRIB4NUBPROC) load("glVertexAttrib4Nub", userptr);
    glGetProgramParameterfvNV = (PFNGLGETPROGRAMPARAMETERFVNVPROC) load("glGetProgramParameterfvNV", userptr);
    glGetVertexAttribiv = (PFNGLGETVERTEXATTRIBIVPROC) load("glGetVertexAttribiv", userptr);
    glVertexAttrib3fv = (PFNGLVERTEXATTRIB3FVPROC) load("glVertexAttrib3fv", userptr);
    glVertexAttrib2fv = (PFNGLVERTEXATTRIB2FVPROC) load("glVertexAttrib2fv", userptr);
    glRequestResidentProgramsNV = (PFNGLREQUESTRESIDENTPROGRAMSNVPROC) load("glRequestResidentProgramsNV", userptr);
    glVertexAttrib3svNV = (PFNGLVERTEXATTRIB3SVNVPROC) load("glVertexAttrib3svNV", userptr);
    glGetVertexAttribdvNV = (PFNGLGETVERTEXATTRIBDVNVPROC) load("glGetVertexAttribdvNV", userptr);
    glVertexAttribs4dvNV = (PFNGLVERTEXATTRIBS4DVNVPROC) load("glVertexAttribs4dvNV", userptr);
    glVertexAttribs3dvNV = (PFNGLVERTEXATTRIBS3DVNVPROC) load("glVertexAttribs3dvNV", userptr);
    glGetTrackMatrixivNV = (PFNGLGETTRACKMATRIXIVNVPROC) load("glGetTrackMatrixivNV", userptr);
    glVertexAttrib1sNV = (PFNGLVERTEXATTRIB1SNVPROC) load("glVertexAttrib1sNV", userptr);
    glVertexAttrib4Nubv = (PFNGLVERTEXATTRIB4NUBVPROC) load("glVertexAttrib4Nubv", userptr);
    glVertexAttrib2fvNV = (PFNGLVERTEXATTRIB2FVNVPROC) load("glVertexAttrib2fvNV", userptr);
    glVertexAttrib3dNV = (PFNGLVERTEXATTRIB3DNVPROC) load("glVertexAttrib3dNV", userptr);
    glVertexAttribs2dvNV = (PFNGLVERTEXATTRIBS2DVNVPROC) load("glVertexAttribs2dvNV", userptr);
    glExecuteProgramNV = (PFNGLEXECUTEPROGRAMNVPROC) load("glExecuteProgramNV", userptr);
    glIsProgramNV = (PFNGLISPROGRAMNVPROC) load("glIsProgramNV", userptr);
    glVertexAttrib2sv = (PFNGLVERTEXATTRIB2SVPROC) load("glVertexAttrib2sv", userptr);
    glVertexAttrib2fNV = (PFNGLVERTEXATTRIB2FNVPROC) load("glVertexAttrib2fNV", userptr);
    glVertexAttrib3fNV = (PFNGLVERTEXATTRIB3FNVPROC) load("glVertexAttrib3fNV", userptr);
    glProgramParameters4fvNV = (PFNGLPROGRAMPARAMETERS4FVNVPROC) load("glProgramParameters4fvNV", userptr);
    glVertexAttrib2d = (PFNGLVERTEXATTRIB2DPROC) load("glVertexAttrib2d", userptr);
    glVertexAttrib2f = (PFNGLVERTEXATTRIB2FPROC) load("glVertexAttrib2f", userptr);
    glVertexAttrib3dv = (PFNGLVERTEXATTRIB3DVPROC) load("glVertexAttrib3dv", userptr);
    glGetVertexAttribfvNV = (PFNGLGETVERTEXATTRIBFVNVPROC) load("glGetVertexAttribfvNV", userptr);
    glVertexAttrib4ubvNV = (PFNGLVERTEXATTRIB4UBVNVPROC) load("glVertexAttrib4ubvNV", userptr);
    glVertexAttrib2dNV = (PFNGLVERTEXATTRIB2DNVPROC) load("glVertexAttrib2dNV", userptr);
    glVertexAttrib2svNV = (PFNGLVERTEXATTRIB2SVNVPROC) load("glVertexAttrib2svNV", userptr);
    glGetVertexAttribPointervNV = (PFNGLGETVERTEXATTRIBPOINTERVNVPROC) load("glGetVertexAttribPointervNV", userptr);
    glProgramParameter4fvNV = (PFNGLPROGRAMPARAMETER4FVNVPROC) load("glProgramParameter4fvNV", userptr);
    glVertexAttrib4dvNV = (PFNGLVERTEXATTRIB4DVNVPROC) load("glVertexAttrib4dvNV", userptr);
    glVertexAttrib1dvNV = (PFNGLVERTEXATTRIB1DVNVPROC) load("glVertexAttrib1dvNV", userptr);
    glVertexAttribs2svNV = (PFNGLVERTEXATTRIBS2SVNVPROC) load("glVertexAttribs2svNV", userptr);
}